

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

bool __thiscall chaiscript::parser::ChaiScript_Parser::Map_Pair(ChaiScript_Parser *this)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  eval_error *this_01;
  long lVar6;
  bool bVar7;
  Position prev_pos;
  string local_88;
  string local_68;
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  File_Position local_28;
  
  lVar6 = (long)(this->m_match_stack).
                super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_match_stack).
                super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_48._0_4_ = (this->m_position).line;
  local_48._4_4_ = (this->m_position).col;
  pcVar2 = (this->m_position).m_pos._M_current;
  pcVar3 = (this->m_position).m_end._M_current;
  uVar4 = *(undefined8 *)&(this->m_position).m_last_col;
  local_38 = SUB84(pcVar3,0);
  uStack_34 = (undefined4)((ulong)pcVar3 >> 0x20);
  uStack_30 = (undefined4)uVar4;
  uStack_2c = (undefined4)((ulong)uVar4 >> 0x20);
  uStack_40 = SUB84(pcVar2,0);
  uStack_3c = (undefined4)((ulong)pcVar2 >> 0x20);
  bVar7 = false;
  bVar5 = Operator(this,0);
  if (bVar5) {
    bVar5 = Symbol(this,":",false,false);
    if (bVar5) {
      bVar5 = Operator(this,0);
      if (!bVar5) {
        this_01 = (eval_error *)__cxa_allocate_exception(0x90);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"Incomplete map pair","");
        local_28.line = (this->m_position).line;
        local_28.column = (this->m_position).col;
        exception::eval_error::eval_error
                  (this_01,&local_68,&local_28,
                   (this->m_filename).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        __cxa_throw(this_01,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
      build_match<chaiscript::eval::Map_Pair_AST_Node>(this,lVar6 >> 4,&local_88);
      bVar7 = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      *(ulong *)((long)&(this->m_position).m_pos._M_current + 4) = CONCAT44(local_38,uStack_3c);
      *(ulong *)((long)&(this->m_position).m_end._M_current + 4) = CONCAT44(uStack_30,uStack_34);
      (this->m_position).line = (undefined4)local_48;
      (this->m_position).col = local_48._4_4_;
      (this->m_position).m_pos._M_current = (char *)CONCAT44(uStack_3c,uStack_40);
      while (psVar1 = (this->m_match_stack).
                      super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
            lVar6 != (long)psVar1 -
                     (long)(this->m_match_stack).
                           super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) {
        (this->m_match_stack).
        super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = psVar1 + -1;
        this_00 = psVar1[-1].super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
      bVar7 = false;
    }
  }
  return bVar7;
}

Assistant:

bool Map_Pair() {
        bool retval = false;

        const auto prev_stack_top = m_match_stack.size();
        const auto prev_pos = m_position;

        if (Operator()) {
          if (Symbol(":")) {
            retval = true;
            if (!Operator()) {
              throw exception::eval_error("Incomplete map pair", File_Position(m_position.line, m_position.col), *m_filename);
            }

            build_match<eval::Map_Pair_AST_Node>(prev_stack_top);
          }
          else {
            m_position = prev_pos;
            while (prev_stack_top != m_match_stack.size()) {
              m_match_stack.pop_back();
            }
          }
        }

        return retval;
      }